

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3_arena.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto3_arena_unittest::TestUnpackedTypes::_InternalSerialize
          (TestUnpackedTypes *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  RepeatedField<long> *pRVar1;
  RepeatedField<unsigned_int> *pRVar2;
  RepeatedField<unsigned_long> *pRVar3;
  RepeatedField<int> *pRVar4;
  RepeatedField<float> *this_00;
  RepeatedField<double> *this_01;
  RepeatedField<bool> *this_02;
  ulong uVar5;
  int iVar6;
  uint8_t *puVar7;
  const_reference piVar8;
  const_reference plVar9;
  const_reference puVar10;
  const_reference puVar11;
  const_reference pfVar12;
  const_reference pdVar13;
  const_reference pbVar14;
  int iVar15;
  
  iVar6 = google::protobuf::RepeatedField<int>::size(&(this->field_0)._impl_.repeated_int32_);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    piVar8 = google::protobuf::RepeatedField<int>::Get
                       (&(this->field_0)._impl_.repeated_int32_,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(1,*piVar8,puVar7);
  }
  pRVar1 = &(this->field_0)._impl_.repeated_int64_;
  iVar6 = google::protobuf::RepeatedField<long>::size(pRVar1);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    plVar9 = google::protobuf::RepeatedField<long>::Get(pRVar1,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteInt64ToArray(2,*plVar9,puVar7);
  }
  pRVar2 = &(this->field_0)._impl_.repeated_uint32_;
  iVar6 = google::protobuf::RepeatedField<unsigned_int>::size(pRVar2);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar10 = google::protobuf::RepeatedField<unsigned_int>::Get(pRVar2,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(3,*puVar10,puVar7);
  }
  pRVar3 = &(this->field_0)._impl_.repeated_uint64_;
  iVar6 = google::protobuf::RepeatedField<unsigned_long>::size(pRVar3);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar11 = google::protobuf::RepeatedField<unsigned_long>::Get(pRVar3,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteUInt64ToArray(4,*puVar11,puVar7);
  }
  pRVar4 = &(this->field_0)._impl_.repeated_sint32_;
  iVar6 = google::protobuf::RepeatedField<int>::size(pRVar4);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    piVar8 = google::protobuf::RepeatedField<int>::Get(pRVar4,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteSInt32ToArray(5,*piVar8,puVar7);
  }
  pRVar1 = &(this->field_0)._impl_.repeated_sint64_;
  iVar6 = google::protobuf::RepeatedField<long>::size(pRVar1);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    plVar9 = google::protobuf::RepeatedField<long>::Get(pRVar1,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteSInt64ToArray(6,*plVar9,puVar7);
  }
  pRVar2 = &(this->field_0)._impl_.repeated_fixed32_;
  iVar6 = google::protobuf::RepeatedField<unsigned_int>::size(pRVar2);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar10 = google::protobuf::RepeatedField<unsigned_int>::Get(pRVar2,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteFixed32ToArray(7,*puVar10,puVar7);
  }
  pRVar3 = &(this->field_0)._impl_.repeated_fixed64_;
  iVar6 = google::protobuf::RepeatedField<unsigned_long>::size(pRVar3);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    puVar11 = google::protobuf::RepeatedField<unsigned_long>::Get(pRVar3,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteFixed64ToArray(8,*puVar11,puVar7);
  }
  pRVar4 = &(this->field_0)._impl_.repeated_sfixed32_;
  iVar6 = google::protobuf::RepeatedField<int>::size(pRVar4);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    piVar8 = google::protobuf::RepeatedField<int>::Get(pRVar4,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteSFixed32ToArray(9,*piVar8,puVar7);
  }
  pRVar1 = &(this->field_0)._impl_.repeated_sfixed64_;
  iVar6 = google::protobuf::RepeatedField<long>::size(pRVar1);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    plVar9 = google::protobuf::RepeatedField<long>::Get(pRVar1,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteSFixed64ToArray(10,*plVar9,puVar7);
  }
  this_00 = &(this->field_0)._impl_.repeated_float_;
  iVar6 = google::protobuf::RepeatedField<float>::size(this_00);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    pfVar12 = google::protobuf::RepeatedField<float>::Get(this_00,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteFloatToArray(0xb,*pfVar12,puVar7);
  }
  this_01 = &(this->field_0)._impl_.repeated_double_;
  iVar6 = google::protobuf::RepeatedField<double>::size(this_01);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    pdVar13 = google::protobuf::RepeatedField<double>::Get(this_01,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteDoubleToArray(0xc,*pdVar13,puVar7);
  }
  this_02 = &(this->field_0)._impl_.repeated_bool_;
  iVar6 = google::protobuf::RepeatedField<bool>::size(this_02);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    pbVar14 = google::protobuf::RepeatedField<bool>::Get(this_02,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteBoolToArray(0xd,*pbVar14,puVar7);
  }
  pRVar4 = &(this->field_0)._impl_.repeated_nested_enum_;
  iVar6 = google::protobuf::RepeatedField<int>::size(pRVar4);
  iVar15 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
    puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    piVar8 = google::protobuf::RepeatedField<int>::Get(pRVar4,iVar15);
    target = google::protobuf::internal::WireFormatLite::WriteEnumToArray(0xe,*piVar8,puVar7);
  }
  uVar5 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    puVar7 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar5 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar7;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestUnpackedTypes::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestUnpackedTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto3_arena_unittest.TestUnpackedTypes)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 repeated_int32 = 1 [packed = false];
  for (int i = 0, n = this_._internal_repeated_int32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        1, this_._internal_repeated_int32().Get(i), target);
  }

  // repeated int64 repeated_int64 = 2 [packed = false];
  for (int i = 0, n = this_._internal_repeated_int64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt64ToArray(
        2, this_._internal_repeated_int64().Get(i), target);
  }

  // repeated uint32 repeated_uint32 = 3 [packed = false];
  for (int i = 0, n = this_._internal_repeated_uint32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        3, this_._internal_repeated_uint32().Get(i), target);
  }

  // repeated uint64 repeated_uint64 = 4 [packed = false];
  for (int i = 0, n = this_._internal_repeated_uint64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt64ToArray(
        4, this_._internal_repeated_uint64().Get(i), target);
  }

  // repeated sint32 repeated_sint32 = 5 [packed = false];
  for (int i = 0, n = this_._internal_repeated_sint32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSInt32ToArray(
        5, this_._internal_repeated_sint32().Get(i), target);
  }

  // repeated sint64 repeated_sint64 = 6 [packed = false];
  for (int i = 0, n = this_._internal_repeated_sint64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSInt64ToArray(
        6, this_._internal_repeated_sint64().Get(i), target);
  }

  // repeated fixed32 repeated_fixed32 = 7 [packed = false];
  for (int i = 0, n = this_._internal_repeated_fixed32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFixed32ToArray(
        7, this_._internal_repeated_fixed32().Get(i), target);
  }

  // repeated fixed64 repeated_fixed64 = 8 [packed = false];
  for (int i = 0, n = this_._internal_repeated_fixed64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFixed64ToArray(
        8, this_._internal_repeated_fixed64().Get(i), target);
  }

  // repeated sfixed32 repeated_sfixed32 = 9 [packed = false];
  for (int i = 0, n = this_._internal_repeated_sfixed32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSFixed32ToArray(
        9, this_._internal_repeated_sfixed32().Get(i), target);
  }

  // repeated sfixed64 repeated_sfixed64 = 10 [packed = false];
  for (int i = 0, n = this_._internal_repeated_sfixed64_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteSFixed64ToArray(
        10, this_._internal_repeated_sfixed64().Get(i), target);
  }

  // repeated float repeated_float = 11 [packed = false];
  for (int i = 0, n = this_._internal_repeated_float_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteFloatToArray(
        11, this_._internal_repeated_float().Get(i), target);
  }

  // repeated double repeated_double = 12 [packed = false];
  for (int i = 0, n = this_._internal_repeated_double_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteDoubleToArray(
        12, this_._internal_repeated_double().Get(i), target);
  }

  // repeated bool repeated_bool = 13 [packed = false];
  for (int i = 0, n = this_._internal_repeated_bool_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        13, this_._internal_repeated_bool().Get(i), target);
  }

  // repeated .proto3_arena_unittest.TestAllTypes.NestedEnum repeated_nested_enum = 14 [packed = false];
  for (int i = 0, n = this_._internal_repeated_nested_enum_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        14, static_cast<::proto3_arena_unittest::TestAllTypes_NestedEnum>(this_._internal_repeated_nested_enum().Get(i)),
        target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto3_arena_unittest.TestUnpackedTypes)
  return target;
}